

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * Catch::fpToString<double>(string *__return_storage_ptr__,double value,int precision)

{
  long lVar1;
  size_type sVar2;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar3;
  size_t sVar4;
  size_type sVar5;
  size_type sVar6;
  ReusableStringStream rss;
  ReusableStringStream local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (NAN(value)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"nan","");
  }
  else {
    local_50.super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_0059d208
    ;
    pSVar3 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
             getInternal();
    sVar4 = StringStreams::add(&pSVar3->super_StringStreams);
    local_50.m_index = sVar4;
    pSVar3 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
             getInternal();
    local_50.m_oss =
         *(ostream **)
          &(pSVar3->super_StringStreams).m_streams.
           super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[sVar4]._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    lVar1 = *(long *)local_50.m_oss;
    *(long *)((long)local_50.m_oss + *(long *)(lVar1 + -0x18) + 8) = (long)precision;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)((long)local_50.m_oss + lVar1 + 0x18) =
         *(uint *)((long)local_50.m_oss + lVar1 + 0x18) & 0xfffffefb | 4;
    std::ostream::_M_insert<double>(value);
    std::__cxx11::stringbuf::str();
    sVar2 = __return_storage_ptr__->_M_string_length;
    sVar5 = 0xffffffffffffffff;
    if (sVar2 != 0) {
      sVar6 = sVar2;
      do {
        sVar6 = sVar6 - 1;
        sVar5 = sVar6;
        if ((__return_storage_ptr__->_M_dataplus)._M_p[sVar6] != '0') break;
        sVar5 = 0xffffffffffffffff;
      } while (sVar6 != 0);
    }
    if (sVar5 != sVar2 - 1 && sVar5 != 0xffffffffffffffff) {
      clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_38,__return_storage_ptr__,0,
                 sVar5 + ((__return_storage_ptr__->_M_dataplus)._M_p[sVar5] == '.') + 1);
      fpToString<double>();
    }
    ReusableStringStream::~ReusableStringStream(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fpToString(T value, int precision) {
    if (Catch::isnan(value)) {
      return "nan";
    }

    ReusableStringStream rss;
    rss << std::setprecision(precision) << std::fixed << value;
    std::string d = rss.str();
    std::size_t i = d.find_last_not_of('0');
    if (i != std::string::npos && i != d.size() - 1) {
      if (d[i] == '.')
        i++;
      d = d.substr(0, i + 1);
    }
    return d;
  }